

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vrle.cpp
# Opt level: O2

void __thiscall VRle::Data::opIntersect(Data *this,VRect *r,VRleSpanCb cb,void *userData)

{
  short sVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Span *pSVar6;
  bool bVar7;
  long lVar8;
  Span *ptr;
  pointer pSVar9;
  pointer pSVar10;
  VRect *pVVar11;
  ushort uVar12;
  int iVar13;
  long lVar14;
  pointer pSVar15;
  Result result;
  VRect local_828 [127];
  
  if ((this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_828[0] = bbox(this);
    bVar7 = VRect::contains(r,local_828,false);
    if (bVar7) {
      pSVar6 = (this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
               super__Vector_impl_data._M_start;
      (*cb)((long)(this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl
                  .super__Vector_impl_data._M_finish - (long)pSVar6 >> 3,pSVar6,userData);
    }
    else {
      pSVar9 = (this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar14 = (long)(this->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pSVar9;
      std::array<VRle::Span,_255UL>::array((array<VRle::Span,_255UL> *)local_828);
      while (lVar14 != 0) {
        pSVar15 = (pointer)((long)&pSVar9->x + lVar14);
        iVar2 = r->x1;
        iVar3 = r->y1;
        iVar4 = r->x2;
        iVar5 = r->y2;
        lVar8 = 0xff;
        pVVar11 = local_828;
        for (; (pSVar10 = pSVar9, lVar8 != 0 && (pSVar9 < pSVar15)); pSVar9 = pSVar9 + 1) {
          sVar1 = pSVar9->y;
          pSVar10 = pSVar15;
          if (iVar5 <= sVar1) break;
          if (iVar3 <= sVar1) {
            iVar13 = (int)pSVar9->x;
            if ((iVar13 < iVar4) && (iVar2 < (int)((uint)pSVar9->len + iVar13))) {
              if (iVar13 < iVar2) {
                iVar13 = (iVar13 - iVar2) + (uint)pSVar9->len;
                if (iVar4 - iVar2 < iVar13) {
                  iVar13 = iVar4 - iVar2;
                }
                *(short *)&pVVar11->x1 = (short)iVar2;
                uVar12 = (ushort)iVar13;
              }
              else {
                *(short *)&pVVar11->x1 = pSVar9->x;
                uVar12 = (short)iVar4 - pSVar9->x;
                if (pSVar9->len <= uVar12) {
                  uVar12 = pSVar9->len;
                }
              }
              *(ushort *)&pVVar11->y1 = uVar12;
              if (uVar12 != 0) {
                *(short *)((long)&pVVar11->x1 + 2) = sVar1;
                *(uint8_t *)((long)&pVVar11->y1 + 2) = pSVar9->coverage;
                pVVar11 = (VRect *)&pVVar11->x2;
                lVar8 = lVar8 + -1;
              }
            }
          }
        }
        lVar14 = (long)pSVar15 - (long)pSVar10;
        pSVar9 = pSVar10;
        if (lVar8 != 0xff) {
          (*cb)(0xff - lVar8,(Span *)local_828,userData);
        }
      }
    }
  }
  return;
}

Assistant:

void VRle::Data::opIntersect(const VRect &r, VRle::VRleSpanCb cb,
                             void *userData) const
{
    if (empty()) return;

    if (r.contains(bbox())) {
        cb(mSpans.size(), mSpans.data(), userData);
        return;
    }

    auto   obj = view();
    Result result;
    // run till all the spans are processed
    while (obj.size()) {
        auto count = _opIntersect(r, obj, result);
        if (count) cb(count, result.data(), userData);
    }
}